

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
eastl::vector<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>::
DoInsertValue(vector<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
              *this,iterator position,value_type *value)

{
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> **pppVar1;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar2;
  int iVar3;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar4;
  generic_iterator<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>_*,_void> gVar5;
  uint n;
  long lVar6;
  
  ppVar2 = (this->
           super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
           ).mpEnd;
  if (ppVar2 == (this->
                super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                ).mpCapacity) {
    iVar3 = (int)(((long)ppVar2 -
                  (long)(this->
                        super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                        ).mpBegin) / 0x28);
    n = 1;
    if (iVar3 != 0) {
      n = iVar3 * 2;
    }
    ppVar4 = VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
             ::DoAllocate(&this->
                           super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                          ,n);
    gVar5 = uninitialized_copy_impl<eastl::generic_iterator<eastl::pair<char,eastl::basic_string<char,eastl::allocator>>*,void>,eastl::generic_iterator<eastl::pair<char,eastl::basic_string<char,eastl::allocator>>*,void>>
                      ((this->
                       super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                       ).mpBegin,position,ppVar4);
    pair<char,_eastl::basic_string<char,_eastl::allocator>_>::pair(gVar5.mIterator,value);
    gVar5 = uninitialized_copy_impl<eastl::generic_iterator<eastl::pair<char,eastl::basic_string<char,eastl::allocator>>*,void>,eastl::generic_iterator<eastl::pair<char,eastl::basic_string<char,eastl::allocator>>*,void>>
                      (position,(this->
                                super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                                ).mpEnd,gVar5.mIterator + 1);
    DoDestroyValues(this,(this->
                         super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                         ).mpBegin,
                    (this->
                    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                    ).mpEnd);
    ppVar2 = (this->
             super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
             ).mpBegin;
    if (ppVar2 != (pair<char,_eastl::basic_string<char,_eastl::allocator>_> *)0x0) {
      operator_delete__(ppVar2);
    }
    (this->
    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
    ).mpBegin = ppVar4;
    (this->
    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
    ).mpEnd = gVar5.mIterator;
    (this->
    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
    ).mpCapacity = ppVar4 + n;
  }
  else {
    lVar6 = 0x28;
    if (ppVar2 <= value) {
      lVar6 = 0;
    }
    if (value < position) {
      lVar6 = 0;
    }
    pair<char,_eastl::basic_string<char,_eastl::allocator>_>::pair(ppVar2,ppVar2 + -1);
    ppVar2 = (this->
             super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
             ).mpEnd;
    copy_backward_impl<false,std::random_access_iterator_tag>::
    do_copy<eastl::pair<char,eastl::basic_string<char,eastl::allocator>>*,eastl::pair<char,eastl::basic_string<char,eastl::allocator>>*>
              (position,ppVar2 + -1,ppVar2);
    pair<char,_eastl::basic_string<char,_eastl::allocator>_>::operator=
              (position,(pair<char,_eastl::basic_string<char,_eastl::allocator>_> *)
                        (&value->first + lVar6));
    pppVar1 = &(this->
               super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
               ).mpEnd;
    *pppVar1 = *pppVar1 + 1;
  }
  return;
}

Assistant:

void vector<T, Allocator>::DoInsertValue(iterator position, const value_type& value)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position > mpEnd)))
                EASTL_FAIL_MSG("vector::insert -- invalid position");
#endif

        if(mpEnd != mpCapacity) // If size < capacity ...
        {
            // EASTL_ASSERT(position < mpEnd); // We don't call this function unless position is less than end, and the code directly below relies on this.
            // We need to take into account the possibility that value may come from within the vector itself.
            const T* pValue = &value;
            if((pValue >= position) && (pValue < mpEnd)) // If value comes from within the range to be moved...
                ++pValue;
            ::new(mpEnd) value_type(*(mpEnd - 1));
            eastl::copy_backward(position, mpEnd - 1, mpEnd); // We need copy_backward because of potential overlap issues.
            *position = *pValue;
            ++mpEnd;
        }
        else // else (size == capacity)
        {
            const size_type nPrevSize = size_type(mpEnd - mpBegin);
            const size_type nNewSize  = GetNewCapacity(nPrevSize);
            pointer const   pNewData  = DoAllocate(nNewSize);

#if EASTL_EXCEPTIONS_ENABLED
                pointer pNewEnd = pNewData;
                try
                {
                    pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                    ::new(pNewEnd) value_type(value);
                    pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
                }
                catch(...)
                {
                    DoDestroyValues(pNewData, pNewEnd);
                    DoFree(pNewData, nNewSize);
                    throw;
                }
#else
                pointer pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                ::new(pNewEnd) value_type(value);
                pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
#endif

            DoDestroyValues(mpBegin, mpEnd);
            DoFree(mpBegin, (size_type)(mpCapacity - mpBegin));

            mpBegin    = pNewData;
            mpEnd      = pNewEnd;
            mpCapacity = pNewData + nNewSize;
        }
    }